

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::Base64Test_encodeTest_Test::TestBody(Base64Test_encodeTest_Test *this)

{
  undefined8 *puVar1;
  undefined1 *input;
  char *message;
  long lVar2;
  string encoded;
  Message local_70;
  internal local_68 [8];
  undefined8 *local_60;
  AssertHelper local_58;
  string local_50;
  
  lVar2 = 0x480;
  input = (anonymous_namespace)::testVector;
  do {
    detail::base64_encode(&local_50,(string *)input);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_68,"test_case.encoded","encoded",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)input + 0x20),&local_50);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_70);
      message = "";
      if (local_60 != (undefined8 *)0x0) {
        message = (char *)*local_60;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
                 ,0x2e,message);
      testing::internal::AssertHelper::operator=(&local_58,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_70.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_70.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    puVar1 = local_60;
    if (local_60 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_60 != local_60 + 2) {
        operator_delete((undefined8 *)*local_60);
      }
      operator_delete(puVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    input = (undefined1 *)((long)input + 0x40);
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != 0);
  return;
}

Assistant:

TEST(Base64Test, encodeTest) {
  for (const auto& test_case : testVector) {
    std::string encoded = detail::base64_encode(test_case.decoded);
    EXPECT_EQ(test_case.encoded, encoded);
  }
}